

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

void __thiscall MuHash3072::Finalize(MuHash3072 *this,uint256 *out)

{
  long lVar1;
  Num3072 *in_RSI;
  Num3072 *in_RDI;
  long in_FS_OFFSET;
  uchar data [384];
  HashWriter *in_stack_fffffffffffffdc8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Num3072::Divide(in_RSI,in_RDI);
  Num3072::SetToOne(in_RSI);
  Num3072::ToBytes(in_RSI,(uchar (*) [384])in_RDI);
  HashWriter::HashWriter(in_stack_fffffffffffffdc8);
  HashWriter::operator<<((HashWriter *)in_RSI,(uchar (*) [384])in_RDI);
  HashWriter::GetSHA256((HashWriter *)in_RSI);
  *(undefined4 *)(in_RSI->limbs + 2) = local_198;
  *(undefined4 *)((long)in_RSI->limbs + 0x14) = uStack_194;
  *(undefined4 *)(in_RSI->limbs + 3) = uStack_190;
  *(undefined4 *)((long)in_RSI->limbs + 0x1c) = uStack_18c;
  *(undefined4 *)in_RSI->limbs = local_1a8;
  *(undefined4 *)((long)in_RSI->limbs + 4) = uStack_1a4;
  *(undefined4 *)(in_RSI->limbs + 1) = uStack_1a0;
  *(undefined4 *)((long)in_RSI->limbs + 0xc) = uStack_19c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MuHash3072::Finalize(uint256& out) noexcept
{
    m_numerator.Divide(m_denominator);
    m_denominator.SetToOne();  // Needed to keep the MuHash object valid

    unsigned char data[Num3072::BYTE_SIZE];
    m_numerator.ToBytes(data);

    out = (HashWriter{} << data).GetSHA256();
}